

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O2

bool QFileSystemEngine::setPermissions
               (QFileSystemEntry *entry,Permissions permissions,QSystemError *error)

{
  bool bVar1;
  mode_t __mode;
  int iVar2;
  uint *puVar3;
  int *piVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QFileSystemEntry::isEmpty(entry);
  if (bVar1) {
LAB_0012bafd:
    piVar4 = __errno_location();
    *piVar4 = 0x16;
  }
  else {
    bVar1 = qIsFilenameBroken(entry);
    if (bVar1) goto LAB_0012bafd;
    __mode = QtPrivate::toMode_t(permissions);
    QFileSystemEntry::nativeFilePath((NativePath *)&local_40,entry);
    if (local_40.ptr == (char *)0x0) {
      local_40.ptr = "";
    }
    iVar2 = chmod(local_40.ptr,__mode);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
    if (iVar2 == 0) {
      bVar1 = true;
      goto LAB_0012bae2;
    }
    puVar3 = (uint *)__errno_location();
    *error = (QSystemError)((ulong)*puVar3 | 0x100000000);
  }
  bVar1 = false;
LAB_0012bae2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemEngine::setPermissions(const QFileSystemEntry &entry,
                                       QFile::Permissions permissions, QSystemError &error)
{
    Q_CHECK_FILE_NAME(entry, false);

    mode_t mode = QtPrivate::toMode_t(permissions);
    bool success = ::chmod(entry.nativeFilePath().constData(), mode) == 0;
    if (!success)
        error = QSystemError(errno, QSystemError::StandardLibraryError);
    return success;
}